

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

int byteoffset(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  lua_Integer lVar2;
  ulong uVar3;
  lua_Integer def;
  ulong uVar4;
  long lVar5;
  size_t len;
  
  len = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&len);
  lVar2 = luaL_checkinteger(L,2);
  def = 1;
  if (lVar2 < 0) {
    def = len + 1;
  }
  uVar3 = luaL_optinteger(L,3,def);
  if ((long)uVar3 < 0) {
    if (len < -uVar3) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 + len + 1;
    }
  }
  uVar4 = uVar3 - 1;
  if (((long)uVar3 < 1) || (uVar3 = uVar4, (long)len < (long)uVar4)) {
    uVar4 = uVar3;
    luaL_argerror(L,3,"position out of bounds");
  }
  if (lVar2 == 0) {
    uVar3 = (long)uVar4 >> 0x3f & uVar4;
    if (0 < (long)uVar4) {
      uVar3 = uVar4;
    }
  }
  else {
    lVar5 = lVar2;
    if (lVar2 < 0) {
      while ((lVar2 < 0 && (0 < (long)uVar4))) {
        if (uVar4 < 2) {
          uVar4 = 0;
        }
        else {
          uVar4 = uVar4 - 1;
        }
        lVar2 = lVar2 + 1;
      }
    }
    else {
      for (; (lVar2 = lVar5 + -1, 1 < lVar5 && ((long)uVar4 < (long)len)); uVar4 = uVar4 + 1) {
        lVar5 = lVar2;
      }
    }
    uVar3 = uVar4;
    if (lVar2 != 0) {
      lua_pushnil(L);
      return 1;
    }
  }
  lVar5 = uVar3 + 1;
  lua_pushinteger(L,lVar5);
  if (pcVar1[uVar3] < '\0') {
    lVar5 = uVar3 + 2;
  }
  lua_pushinteger(L,lVar5);
  return 2;
}

Assistant:

static int byteoffset (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n  = luaL_checkinteger(L, 2);
  lua_Integer posi = (n >= 0) ? 1 : cast_st2S(len) + 1;
  posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 3,
                   "position out of bounds");
  if (n == 0) {
    /* find beginning of current byte sequence */
    while (posi > 0 && iscontp(s + posi)) posi--;
  }
  else {
    if (iscontp(s + posi))
      return luaL_error(L, "initial position is a continuation byte");
    if (n < 0) {
      while (n < 0 && posi > 0) {  /* move back */
        do {  /* find beginning of previous character */
          posi--;
        } while (posi > 0 && iscontp(s + posi));
        n++;
      }
    }
    else {
      n--;  /* do not move for 1st character */
      while (n > 0 && posi < (lua_Integer)len) {
        do {  /* find beginning of next character */
          posi++;
        } while (iscontp(s + posi));  /* (cannot pass final '\0') */
        n--;
      }
    }
  }
  if (n != 0) {  /* did not find given character? */
    luaL_pushfail(L);
    return 1;
  }
  lua_pushinteger(L, posi + 1);  /* initial position */
  if ((s[posi] & 0x80) != 0) {  /* multi-byte character? */
    do {
      posi++;
    } while (iscontp(s + posi + 1));  /* skip to final byte */
  }
  /* else one-byte character: final position is the initial one */
  lua_pushinteger(L, posi + 1);  /* 'posi' now is the final position */
  return 2;
}